

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-compress.c
# Opt level: O0

void PutDescriptorBit(cc_bool bit,KosinskiCompressCallbacks *callbacks)

{
  KosinskiCompressCallbacks *callbacks_local;
  cc_bool bit_local;
  
  descriptor = (uint)bit << 0xf | descriptor >> 1;
  descriptor_bits_remaining = descriptor_bits_remaining - 1;
  if (descriptor_bits_remaining == 0) {
    FlushData(callbacks);
    descriptor_bits_remaining = 0x10;
    match_buffer_index = 0;
  }
  return;
}

Assistant:

static void PutDescriptorBit(const cc_bool bit, const KosinskiCompressCallbacks* const callbacks)
{
	descriptor >>= 1;

	descriptor |= (unsigned int)bit << (TOTAL_DESCRIPTOR_BITS - 1);

	if (--descriptor_bits_remaining == 0)
	{
		FlushData(callbacks);

		descriptor_bits_remaining = TOTAL_DESCRIPTOR_BITS;
		match_buffer_index = 0; /* TODO: Move this to `FlushData`. */
	}
}